

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar_test.cpp
# Opt level: O0

void __thiscall
biosoup::test::BiosoupProgressBarTest_Operator_Test::TestBody
          (BiosoupProgressBarTest_Operator_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_1b50;
  Message local_1b48;
  string local_1b40;
  undefined1 local_1b20 [8];
  AssertionResult gtest_ar_51;
  AssertHelper local_1ad8;
  Message local_1ad0;
  string local_1ac8;
  undefined1 local_1aa8 [8];
  AssertionResult gtest_ar_50;
  AssertHelper local_1a78;
  Message local_1a70;
  bool local_1a61;
  undefined1 local_1a60 [8];
  AssertionResult gtest_ar__44;
  Message local_1a48;
  string local_1a40;
  undefined1 local_1a20 [8];
  AssertionResult gtest_ar_49;
  AssertHelper local_19f0;
  Message local_19e8;
  bool local_19d9;
  undefined1 local_19d8 [8];
  AssertionResult gtest_ar__43;
  Message local_19c0;
  string local_19b8;
  undefined1 local_1998 [8];
  AssertionResult gtest_ar_48;
  AssertHelper local_1968;
  Message local_1960;
  bool local_1951;
  undefined1 local_1950 [8];
  AssertionResult gtest_ar__42;
  Message local_1938;
  string local_1930;
  undefined1 local_1910 [8];
  AssertionResult gtest_ar_47;
  AssertHelper local_18e0;
  Message local_18d8;
  bool local_18c9;
  undefined1 local_18c8 [8];
  AssertionResult gtest_ar__41;
  Message local_18b0;
  string local_18a8;
  undefined1 local_1888 [8];
  AssertionResult gtest_ar_46;
  AssertHelper local_1858;
  Message local_1850;
  bool local_1841;
  undefined1 local_1840 [8];
  AssertionResult gtest_ar__40;
  Message local_1828;
  string local_1820;
  undefined1 local_1800 [8];
  AssertionResult gtest_ar_45;
  AssertHelper local_17d0;
  Message local_17c8;
  bool local_17b9;
  undefined1 local_17b8 [8];
  AssertionResult gtest_ar__39;
  Message local_17a0;
  string local_1798;
  undefined1 local_1778 [8];
  AssertionResult gtest_ar_44;
  AssertHelper local_1748;
  Message local_1740;
  bool local_1731;
  undefined1 local_1730 [8];
  AssertionResult gtest_ar__38;
  Message local_1718;
  string local_1710;
  undefined1 local_16f0 [8];
  AssertionResult gtest_ar_43;
  AssertHelper local_16c0;
  Message local_16b8;
  bool local_16a9;
  undefined1 local_16a8 [8];
  AssertionResult gtest_ar__37;
  Message local_1690;
  string local_1688;
  undefined1 local_1668 [8];
  AssertionResult gtest_ar_42;
  AssertHelper local_1638;
  Message local_1630;
  bool local_1621;
  undefined1 local_1620 [8];
  AssertionResult gtest_ar__36;
  Message local_1608;
  string local_1600;
  undefined1 local_15e0 [8];
  AssertionResult gtest_ar_41;
  AssertHelper local_1598;
  Message local_1590;
  string local_1588;
  undefined1 local_1568 [8];
  AssertionResult gtest_ar_40;
  AssertHelper local_1538;
  Message local_1530;
  bool local_1521;
  undefined1 local_1520 [8];
  AssertionResult gtest_ar__35;
  Message local_1508;
  string local_1500;
  undefined1 local_14e0 [8];
  AssertionResult gtest_ar_39;
  AssertHelper local_14b0;
  Message local_14a8;
  bool local_1499;
  undefined1 local_1498 [8];
  AssertionResult gtest_ar__34;
  Message local_1480;
  string local_1478;
  undefined1 local_1458 [8];
  AssertionResult gtest_ar_38;
  AssertHelper local_1428;
  Message local_1420;
  bool local_1411;
  undefined1 local_1410 [8];
  AssertionResult gtest_ar__33;
  Message local_13f8;
  string local_13f0;
  undefined1 local_13d0 [8];
  AssertionResult gtest_ar_37;
  AssertHelper local_13a0;
  Message local_1398;
  bool local_1389;
  undefined1 local_1388 [8];
  AssertionResult gtest_ar__32;
  Message local_1370;
  string local_1368;
  undefined1 local_1348 [8];
  AssertionResult gtest_ar_36;
  AssertHelper local_1318;
  Message local_1310;
  bool local_1301;
  undefined1 local_1300 [8];
  AssertionResult gtest_ar__31;
  Message local_12e8;
  string local_12e0;
  undefined1 local_12c0 [8];
  AssertionResult gtest_ar_35;
  AssertHelper local_1290;
  Message local_1288;
  bool local_1279;
  undefined1 local_1278 [8];
  AssertionResult gtest_ar__30;
  Message local_1260;
  string local_1258;
  undefined1 local_1238 [8];
  AssertionResult gtest_ar_34;
  AssertHelper local_1208;
  Message local_1200;
  bool local_11f1;
  undefined1 local_11f0 [8];
  AssertionResult gtest_ar__29;
  Message local_11d8;
  string local_11d0;
  undefined1 local_11b0 [8];
  AssertionResult gtest_ar_33;
  AssertHelper local_1180;
  Message local_1178;
  bool local_1169;
  undefined1 local_1168 [8];
  AssertionResult gtest_ar__28;
  Message local_1150;
  string local_1148;
  undefined1 local_1128 [8];
  AssertionResult gtest_ar_32;
  AssertHelper local_10f8;
  Message local_10f0;
  bool local_10e1;
  undefined1 local_10e0 [8];
  AssertionResult gtest_ar__27;
  Message local_10c8;
  string local_10c0;
  undefined1 local_10a0 [8];
  AssertionResult gtest_ar_31;
  AssertHelper local_1058;
  Message local_1050;
  string local_1048;
  undefined1 local_1028 [8];
  AssertionResult gtest_ar_30;
  AssertHelper local_ff8;
  Message local_ff0;
  bool local_fe1;
  undefined1 local_fe0 [8];
  AssertionResult gtest_ar__26;
  Message local_fc8;
  string local_fc0;
  undefined1 local_fa0 [8];
  AssertionResult gtest_ar_29;
  AssertHelper local_f70;
  Message local_f68;
  bool local_f59;
  undefined1 local_f58 [8];
  AssertionResult gtest_ar__25;
  Message local_f40;
  string local_f38;
  undefined1 local_f18 [8];
  AssertionResult gtest_ar_28;
  AssertHelper local_ee8;
  Message local_ee0;
  bool local_ed1;
  undefined1 local_ed0 [8];
  AssertionResult gtest_ar__24;
  Message local_eb8;
  string local_eb0;
  undefined1 local_e90 [8];
  AssertionResult gtest_ar_27;
  AssertHelper local_e60;
  Message local_e58;
  bool local_e49;
  undefined1 local_e48 [8];
  AssertionResult gtest_ar__23;
  Message local_e30;
  string local_e28;
  undefined1 local_e08 [8];
  AssertionResult gtest_ar_26;
  AssertHelper local_dd8;
  Message local_dd0;
  bool local_dc1;
  undefined1 local_dc0 [8];
  AssertionResult gtest_ar__22;
  Message local_da8;
  string local_da0;
  undefined1 local_d80 [8];
  AssertionResult gtest_ar_25;
  AssertHelper local_d50;
  Message local_d48;
  bool local_d39;
  undefined1 local_d38 [8];
  AssertionResult gtest_ar__21;
  Message local_d20;
  string local_d18;
  undefined1 local_cf8 [8];
  AssertionResult gtest_ar_24;
  AssertHelper local_cc8;
  Message local_cc0;
  bool local_cb1;
  undefined1 local_cb0 [8];
  AssertionResult gtest_ar__20;
  Message local_c98;
  string local_c90;
  undefined1 local_c70 [8];
  AssertionResult gtest_ar_23;
  AssertHelper local_c40;
  Message local_c38;
  bool local_c29;
  undefined1 local_c28 [8];
  AssertionResult gtest_ar__19;
  Message local_c10;
  string local_c08;
  undefined1 local_be8 [8];
  AssertionResult gtest_ar_22;
  AssertHelper local_bb8;
  Message local_bb0;
  bool local_ba1;
  undefined1 local_ba0 [8];
  AssertionResult gtest_ar__18;
  Message local_b88;
  string local_b80;
  undefined1 local_b60 [8];
  AssertionResult gtest_ar_21;
  AssertHelper local_b18;
  Message local_b10;
  string local_b08;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar_20;
  AssertHelper local_ab8;
  Message local_ab0;
  bool local_aa1;
  undefined1 local_aa0 [8];
  AssertionResult gtest_ar__17;
  Message local_a88;
  string local_a80;
  undefined1 local_a60 [8];
  AssertionResult gtest_ar_19;
  AssertHelper local_a30;
  Message local_a28;
  bool local_a19;
  undefined1 local_a18 [8];
  AssertionResult gtest_ar__16;
  Message local_a00;
  string local_9f8;
  undefined1 local_9d8 [8];
  AssertionResult gtest_ar_18;
  AssertHelper local_9a8;
  Message local_9a0;
  bool local_991;
  undefined1 local_990 [8];
  AssertionResult gtest_ar__15;
  Message local_978;
  string local_970;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_17;
  AssertHelper local_920;
  Message local_918;
  bool local_909;
  undefined1 local_908 [8];
  AssertionResult gtest_ar__14;
  Message local_8f0;
  string local_8e8;
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar_16;
  AssertHelper local_898;
  Message local_890;
  bool local_881;
  undefined1 local_880 [8];
  AssertionResult gtest_ar__13;
  Message local_868;
  string local_860;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_15;
  AssertHelper local_810;
  Message local_808;
  bool local_7f9;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar__12;
  Message local_7e0;
  string local_7d8;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar_14;
  AssertHelper local_788;
  Message local_780;
  bool local_771;
  undefined1 local_770 [8];
  AssertionResult gtest_ar__11;
  Message local_758;
  string local_750;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_700;
  Message local_6f8;
  bool local_6e9;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar__10;
  Message local_6d0;
  string local_6c8;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_678;
  Message local_670;
  bool local_661;
  undefined1 local_660 [8];
  AssertionResult gtest_ar__9;
  Message local_648;
  string local_640;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_5d8;
  Message local_5d0;
  string local_5c8;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_560;
  Message local_558;
  string local_550;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_500;
  Message local_4f8;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__8;
  Message local_4d0;
  string local_4c8;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_478;
  Message local_470;
  bool local_461;
  undefined1 local_460 [8];
  AssertionResult gtest_ar__7;
  Message local_448;
  string local_440;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_3f0;
  Message local_3e8;
  bool local_3d9;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__6;
  Message local_3c0;
  string local_3b8;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_368;
  Message local_360;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__5;
  Message local_338;
  string local_330;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_2e0;
  Message local_2d8;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__4;
  Message local_2b0;
  string local_2a8;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_258;
  Message local_250;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__3;
  Message local_228;
  string local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_1d0;
  Message local_1c8;
  bool local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__2;
  Message local_1a0;
  string local_198;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  Message local_118;
  string local_110;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_;
  Message local_90 [3];
  string local_78;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  ProgressBar pb;
  BiosoupProgressBarTest_Operator_Test *this_local;
  
  ProgressBar::ProgressBar((ProgressBar *)&gtest_ar.message_,8,8);
  testing::PrintToString<biosoup::ProgressBar>(&local_78,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_58,"\"        \"","::testing::PrintToString(pb)",
             (char (*) [9])0x16afa0,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0xc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_a9 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_a8,(AssertionResult *)"++pb","false"
               ,"true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0xd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  testing::PrintToString<biosoup::ProgressBar>(&local_110,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_f0,"\"=>      \"","::testing::PrintToString(pb)",
             (char (*) [9])"=>      ",&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_131 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_130,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0xf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  testing::PrintToString<biosoup::ProgressBar>(&local_198,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_178,"\"==>     \"","::testing::PrintToString(pb)",
             (char (*) [9])"==>     ",&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1b9 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b8,&local_1b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_1b8,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  testing::PrintToString<biosoup::ProgressBar>(&local_220,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_200,"\"===>    \"","::testing::PrintToString(pb)",
             (char (*) [9])"===>    ",&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_241 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_240,&local_241,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_240,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x13,pcVar2);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  testing::PrintToString<biosoup::ProgressBar>(&local_2a8,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_288,"\"====>   \"","::testing::PrintToString(pb)",
             (char (*) [9])"====>   ",&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2c9 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_2c8,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  testing::PrintToString<biosoup::ProgressBar>(&local_330,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_310,"\"=====>  \"","::testing::PrintToString(pb)",
             (char (*) [9])"=====>  ",&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_351 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_350,&local_351,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6.message_,(internal *)local_350,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=(&local_368,&local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  testing::PrintToString<biosoup::ProgressBar>(&local_3b8,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_398,"\"======> \"","::testing::PrintToString(pb)",
             (char (*) [9])"======> ",&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  local_3d9 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d8,&local_3d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7.message_,(internal *)local_3d8,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  testing::PrintToString<biosoup::ProgressBar>(&local_440,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_420,"\"=======>\"","::testing::PrintToString(pb)",
             (char (*) [9])"=======>",&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_448);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  local_461 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_460,&local_461,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_8.message_,(internal *)local_460,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_478,&local_470);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  testing::PrintToString<biosoup::ProgressBar>(&local_4c8,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_4a8,"\"========\"","::testing::PrintToString(pb)",
             (char (*) [9])"========",&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_4e9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_9.message_,(internal *)local_4e8,(AssertionResult *)"++pb","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  testing::PrintToString<biosoup::ProgressBar>(&local_550,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_530,"\"========\"","::testing::PrintToString(pb)",
             (char (*) [9])"========",&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(&local_558);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              (&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_560,&local_558);
    testing::internal::AssertHelper::~AssertHelper(&local_560);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  ProgressBar::ProgressBar((ProgressBar *)&gtest_ar_10.message_,8,9);
  ProgressBar::operator=((ProgressBar *)&gtest_ar.message_,(ProgressBar *)&gtest_ar_10.message_);
  ProgressBar::~ProgressBar((ProgressBar *)&gtest_ar_10.message_);
  testing::PrintToString<biosoup::ProgressBar>(&local_5c8,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_5a8,"\"        \"","::testing::PrintToString(pb)",
             (char (*) [9])0x16afa0,&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_5d8);
    testing::Message::~Message(&local_5d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  ProgressBar::ProgressBar((ProgressBar *)&gtest_ar_11.message_,8,7);
  ProgressBar::operator=((ProgressBar *)&gtest_ar.message_,(ProgressBar *)&gtest_ar_11.message_);
  ProgressBar::~ProgressBar((ProgressBar *)&gtest_ar_11.message_);
  testing::PrintToString<biosoup::ProgressBar>(&local_640,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_620,"\"       \"","::testing::PrintToString(pb)",
             (char (*) [8])0x16afa1,&local_640);
  std::__cxx11::string::~string((string *)&local_640);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_648);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__9.message_,&local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_661 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_660,&local_661,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar1) {
    testing::Message::Message(&local_670);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_12.message_,(internal *)local_660,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_678,&local_670);
    testing::internal::AssertHelper::~AssertHelper(&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  testing::PrintToString<biosoup::ProgressBar>(&local_6c8,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_6a8,"\"       \"","::testing::PrintToString(pb)",
             (char (*) [8])0x16afa1,&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__10.message_,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  local_6e9 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6e8,&local_6e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
  if (!bVar1) {
    testing::Message::Message(&local_6f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_13.message_,(internal *)local_6e8,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_700,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_700,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper(&local_700);
    std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
  testing::PrintToString<biosoup::ProgressBar>(&local_750,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_730,"\"=>     \"","::testing::PrintToString(pb)",
             (char (*) [8])0x167f4b,&local_750);
  std::__cxx11::string::~string((string *)&local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  local_771 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_770,&local_771,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_14.message_,(internal *)local_770,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_788,&local_780);
    testing::internal::AssertHelper::~AssertHelper(&local_788);
    std::__cxx11::string::~string((string *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  testing::PrintToString<biosoup::ProgressBar>(&local_7d8,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_7b8,"\"==>    \"","::testing::PrintToString(pb)",
             (char (*) [8])0x167f5f,&local_7d8);
  std::__cxx11::string::~string((string *)&local_7d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar1) {
    testing::Message::Message(&local_7e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__12.message_,&local_7e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_7e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  local_7f9 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7f8,&local_7f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar1) {
    testing::Message::Message(&local_808);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_15.message_,(internal *)local_7f8,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_810,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_810,&local_808);
    testing::internal::AssertHelper::~AssertHelper(&local_810);
    std::__cxx11::string::~string((string *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  testing::PrintToString<biosoup::ProgressBar>(&local_860,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_840,"\"===>   \"","::testing::PrintToString(pb)",
             (char (*) [8])0x167f73,&local_860);
  std::__cxx11::string::~string((string *)&local_860);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(&local_868);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__13.message_,&local_868);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  local_881 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_880,&local_881,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_880);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_16.message_,(internal *)local_880,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_898,&local_890);
    testing::internal::AssertHelper::~AssertHelper(&local_898);
    std::__cxx11::string::~string((string *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_880);
  testing::PrintToString<biosoup::ProgressBar>(&local_8e8,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_8c8,"\"====>  \"","::testing::PrintToString(pb)",
             (char (*) [8])0x167f87,&local_8e8);
  std::__cxx11::string::~string((string *)&local_8e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c8);
  if (!bVar1) {
    testing::Message::Message(&local_8f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14.message_,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c8);
  local_909 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_908,&local_909,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar1) {
    testing::Message::Message(&local_918);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_17.message_,(internal *)local_908,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_920,&local_918);
    testing::internal::AssertHelper::~AssertHelper(&local_920);
    std::__cxx11::string::~string((string *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  testing::PrintToString<biosoup::ProgressBar>(&local_970,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_950,"\"=====> \"","::testing::PrintToString(pb)",
             (char (*) [8])0x167f9b,&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__15.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  local_991 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_990,&local_991,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar1) {
    testing::Message::Message(&local_9a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_18.message_,(internal *)local_990,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9a8,&local_9a0);
    testing::internal::AssertHelper::~AssertHelper(&local_9a8);
    std::__cxx11::string::~string((string *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_9a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  testing::PrintToString<biosoup::ProgressBar>(&local_9f8,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_9d8,"\"======>\"","::testing::PrintToString(pb)",
             (char (*) [8])0x167faf,&local_9f8);
  std::__cxx11::string::~string((string *)&local_9f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d8);
  if (!bVar1) {
    testing::Message::Message(&local_a00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__16.message_,&local_a00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d8);
  local_a19 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a18,&local_a19,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a18);
  if (!bVar1) {
    testing::Message::Message(&local_a28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_19.message_,(internal *)local_a18,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a30,&local_a28);
    testing::internal::AssertHelper::~AssertHelper(&local_a30);
    std::__cxx11::string::~string((string *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a18);
  testing::PrintToString<biosoup::ProgressBar>(&local_a80,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_a60,"\"=======\"","::testing::PrintToString(pb)",
             (char (*) [8])0x167fc3,&local_a80);
  std::__cxx11::string::~string((string *)&local_a80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a60);
  if (!bVar1) {
    testing::Message::Message(&local_a88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__17.message_,&local_a88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_a88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a60);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_aa1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_aa0,&local_aa1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa0);
  if (!bVar1) {
    testing::Message::Message(&local_ab0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_20.message_,(internal *)local_aa0,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ab8,&local_ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_ab8);
    std::__cxx11::string::~string((string *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_ab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa0);
  testing::PrintToString<biosoup::ProgressBar>(&local_b08,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_ae8,"\"=======\"","::testing::PrintToString(pb)",
             (char (*) [8])0x167fc3,&local_b08);
  std::__cxx11::string::~string((string *)&local_b08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
  if (!bVar1) {
    testing::Message::Message(&local_b10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ae8);
    testing::internal::AssertHelper::AssertHelper
              (&local_b18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b18,&local_b10);
    testing::internal::AssertHelper::~AssertHelper(&local_b18);
    testing::Message::~Message(&local_b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
  ProgressBar::ProgressBar((ProgressBar *)&gtest_ar_21.message_,8,4);
  ProgressBar::operator=((ProgressBar *)&gtest_ar.message_,(ProgressBar *)&gtest_ar_21.message_);
  ProgressBar::~ProgressBar((ProgressBar *)&gtest_ar_21.message_);
  testing::PrintToString<biosoup::ProgressBar>(&local_b80,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_b60,"\"    \"","::testing::PrintToString(pb)",(char (*) [5])0x16afa4,
             &local_b80);
  std::__cxx11::string::~string((string *)&local_b80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b60);
  if (!bVar1) {
    testing::Message::Message(&local_b88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__18.message_,&local_b88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_b88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b60);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_ba1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ba0,&local_ba1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba0);
  if (!bVar1) {
    testing::Message::Message(&local_bb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_22.message_,(internal *)local_ba0,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bb8,&local_bb0);
    testing::internal::AssertHelper::~AssertHelper(&local_bb8);
    std::__cxx11::string::~string((string *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_bb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba0);
  testing::PrintToString<biosoup::ProgressBar>(&local_c08,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_be8,"\"    \"","::testing::PrintToString(pb)",(char (*) [5])0x16afa4,
             &local_c08);
  std::__cxx11::string::~string((string *)&local_c08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be8);
  if (!bVar1) {
    testing::Message::Message(&local_c10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_be8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__19.message_,&local_c10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_c10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be8);
  local_c29 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c28,&local_c29,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c28);
  if (!bVar1) {
    testing::Message::Message(&local_c38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_23.message_,(internal *)local_c28,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c40,&local_c38);
    testing::internal::AssertHelper::~AssertHelper(&local_c40);
    std::__cxx11::string::~string((string *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_c38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c28);
  testing::PrintToString<biosoup::ProgressBar>(&local_c90,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_c70,"\"=>  \"","::testing::PrintToString(pb)",(char (*) [5])0x167f8a,
             &local_c90);
  std::__cxx11::string::~string((string *)&local_c90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c70);
  if (!bVar1) {
    testing::Message::Message(&local_c98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__20.message_,&local_c98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c70);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_cb1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cb0,&local_cb1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb0);
  if (!bVar1) {
    testing::Message::Message(&local_cc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_24.message_,(internal *)local_cb0,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_cc8,&local_cc0);
    testing::internal::AssertHelper::~AssertHelper(&local_cc8);
    std::__cxx11::string::~string((string *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_cc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb0);
  testing::PrintToString<biosoup::ProgressBar>(&local_d18,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_cf8,"\"=>  \"","::testing::PrintToString(pb)",(char (*) [5])0x167f8a,
             &local_d18);
  std::__cxx11::string::~string((string *)&local_d18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf8);
  if (!bVar1) {
    testing::Message::Message(&local_d20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cf8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__21.message_,&local_d20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf8);
  local_d39 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d38,&local_d39,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d38);
  if (!bVar1) {
    testing::Message::Message(&local_d48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_25.message_,(internal *)local_d38,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d50,&local_d48);
    testing::internal::AssertHelper::~AssertHelper(&local_d50);
    std::__cxx11::string::~string((string *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_d48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d38);
  testing::PrintToString<biosoup::ProgressBar>(&local_da0,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_d80,"\"==> \"","::testing::PrintToString(pb)",(char (*) [5])0x167f9e,
             &local_da0);
  std::__cxx11::string::~string((string *)&local_da0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d80);
  if (!bVar1) {
    testing::Message::Message(&local_da8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__22.message_,&local_da8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_da8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d80);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_dc1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_dc0,&local_dc1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dc0);
  if (!bVar1) {
    testing::Message::Message(&local_dd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_26.message_,(internal *)local_dc0,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_dd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_dd8,&local_dd0);
    testing::internal::AssertHelper::~AssertHelper(&local_dd8);
    std::__cxx11::string::~string((string *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_dd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dc0);
  testing::PrintToString<biosoup::ProgressBar>(&local_e28,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_e08,"\"==> \"","::testing::PrintToString(pb)",(char (*) [5])0x167f9e,
             &local_e28);
  std::__cxx11::string::~string((string *)&local_e28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e08);
  if (!bVar1) {
    testing::Message::Message(&local_e30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__23.message_,&local_e30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_e30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e08);
  local_e49 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e48,&local_e49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e48);
  if (!bVar1) {
    testing::Message::Message(&local_e58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_27.message_,(internal *)local_e48,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e60,&local_e58);
    testing::internal::AssertHelper::~AssertHelper(&local_e60);
    std::__cxx11::string::~string((string *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_e58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e48);
  testing::PrintToString<biosoup::ProgressBar>(&local_eb0,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_e90,"\"===>\"","::testing::PrintToString(pb)",(char (*) [5])0x167fb2,
             &local_eb0);
  std::__cxx11::string::~string((string *)&local_eb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e90);
  if (!bVar1) {
    testing::Message::Message(&local_eb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__24.message_,&local_eb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_eb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e90);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_ed1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ed0,&local_ed1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ed0);
  if (!bVar1) {
    testing::Message::Message(&local_ee0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_28.message_,(internal *)local_ed0,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ee8,&local_ee0);
    testing::internal::AssertHelper::~AssertHelper(&local_ee8);
    std::__cxx11::string::~string((string *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_ee0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ed0);
  testing::PrintToString<biosoup::ProgressBar>(&local_f38,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_f18,"\"===>\"","::testing::PrintToString(pb)",(char (*) [5])0x167fb2,
             &local_f38);
  std::__cxx11::string::~string((string *)&local_f38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f18);
  if (!bVar1) {
    testing::Message::Message(&local_f40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__25.message_,&local_f40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_f40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f18);
  local_f59 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f58,&local_f59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f58);
  if (!bVar1) {
    testing::Message::Message(&local_f68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_29.message_,(internal *)local_f58,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f70,&local_f68);
    testing::internal::AssertHelper::~AssertHelper(&local_f70);
    std::__cxx11::string::~string((string *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_f68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f58);
  testing::PrintToString<biosoup::ProgressBar>(&local_fc0,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_fa0,"\"====\"","::testing::PrintToString(pb)",(char (*) [5])0x167fc6,
             &local_fc0);
  std::__cxx11::string::~string((string *)&local_fc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa0);
  if (!bVar1) {
    testing::Message::Message(&local_fc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fa0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__26.message_,&local_fc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_fc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa0);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_fe1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fe0,&local_fe1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fe0);
  if (!bVar1) {
    testing::Message::Message(&local_ff0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_30.message_,(internal *)local_fe0,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ff8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ff8,&local_ff0);
    testing::internal::AssertHelper::~AssertHelper(&local_ff8);
    std::__cxx11::string::~string((string *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_ff0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fe0);
  testing::PrintToString<biosoup::ProgressBar>(&local_1048,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1028,"\"====\"","::testing::PrintToString(pb)",(char (*) [5])0x167fc6
             ,&local_1048);
  std::__cxx11::string::~string((string *)&local_1048);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1028);
  if (!bVar1) {
    testing::Message::Message(&local_1050);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1028);
    testing::internal::AssertHelper::AssertHelper
              (&local_1058,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1058,&local_1050);
    testing::internal::AssertHelper::~AssertHelper(&local_1058);
    testing::Message::~Message(&local_1050);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1028);
  ProgressBar::ProgressBar((ProgressBar *)&gtest_ar_31.message_,8,2);
  ProgressBar::operator=((ProgressBar *)&gtest_ar.message_,(ProgressBar *)&gtest_ar_31.message_);
  ProgressBar::~ProgressBar((ProgressBar *)&gtest_ar_31.message_);
  testing::PrintToString<biosoup::ProgressBar>(&local_10c0,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_10a0,"\"  \"","::testing::PrintToString(pb)",(char (*) [3])0x169e65,
             &local_10c0);
  std::__cxx11::string::~string((string *)&local_10c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10a0);
  if (!bVar1) {
    testing::Message::Message(&local_10c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__27.message_,&local_10c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_10c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10a0);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_10e1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10e0,&local_10e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10e0);
  if (!bVar1) {
    testing::Message::Message(&local_10f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_32.message_,(internal *)local_10e0,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_10f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_10f8,&local_10f0);
    testing::internal::AssertHelper::~AssertHelper(&local_10f8);
    std::__cxx11::string::~string((string *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_10f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10e0);
  testing::PrintToString<biosoup::ProgressBar>(&local_1148,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1128,"\"  \"","::testing::PrintToString(pb)",(char (*) [3])0x169e65,
             &local_1148);
  std::__cxx11::string::~string((string *)&local_1148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1128);
  if (!bVar1) {
    testing::Message::Message(&local_1150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__28.message_,&local_1150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_1150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1128);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_1169 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1168,&local_1169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1168);
  if (!bVar1) {
    testing::Message::Message(&local_1178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_33.message_,(internal *)local_1168,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1180,&local_1178);
    testing::internal::AssertHelper::~AssertHelper(&local_1180);
    std::__cxx11::string::~string((string *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_1178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1168);
  testing::PrintToString<biosoup::ProgressBar>(&local_11d0,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_11b0,"\"  \"","::testing::PrintToString(pb)",(char (*) [3])0x169e65,
             &local_11d0);
  std::__cxx11::string::~string((string *)&local_11d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11b0);
  if (!bVar1) {
    testing::Message::Message(&local_11d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__29.message_,&local_11d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_11d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11b0);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_11f1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_11f0,&local_11f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11f0);
  if (!bVar1) {
    testing::Message::Message(&local_1200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_34.message_,(internal *)local_11f0,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1208,&local_1200);
    testing::internal::AssertHelper::~AssertHelper(&local_1208);
    std::__cxx11::string::~string((string *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_1200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11f0);
  testing::PrintToString<biosoup::ProgressBar>(&local_1258,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1238,"\"  \"","::testing::PrintToString(pb)",(char (*) [3])0x169e65,
             &local_1258);
  std::__cxx11::string::~string((string *)&local_1258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1238);
  if (!bVar1) {
    testing::Message::Message(&local_1260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__30.message_,&local_1260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_1260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1238);
  local_1279 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1278,&local_1279,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1278);
  if (!bVar1) {
    testing::Message::Message(&local_1288);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_35.message_,(internal *)local_1278,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1290,&local_1288);
    testing::internal::AssertHelper::~AssertHelper(&local_1290);
    std::__cxx11::string::~string((string *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_1288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1278);
  testing::PrintToString<biosoup::ProgressBar>(&local_12e0,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_12c0,"\"=>\"","::testing::PrintToString(pb)",(char (*) [3])0x167fb4,
             &local_12e0);
  std::__cxx11::string::~string((string *)&local_12e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12c0);
  if (!bVar1) {
    testing::Message::Message(&local_12e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__31.message_,&local_12e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__31.message_);
    testing::Message::~Message(&local_12e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c0);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_1301 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1300,&local_1301,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1300);
  if (!bVar1) {
    testing::Message::Message(&local_1310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_36.message_,(internal *)local_1300,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1318,&local_1310);
    testing::internal::AssertHelper::~AssertHelper(&local_1318);
    std::__cxx11::string::~string((string *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_1310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1300);
  testing::PrintToString<biosoup::ProgressBar>(&local_1368,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1348,"\"=>\"","::testing::PrintToString(pb)",(char (*) [3])0x167fb4,
             &local_1368);
  std::__cxx11::string::~string((string *)&local_1368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1348);
  if (!bVar1) {
    testing::Message::Message(&local_1370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__32.message_,&local_1370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__32.message_);
    testing::Message::~Message(&local_1370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1348);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_1389 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1388,&local_1389,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1388);
  if (!bVar1) {
    testing::Message::Message(&local_1398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_37.message_,(internal *)local_1388,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_13a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=(&local_13a0,&local_1398);
    testing::internal::AssertHelper::~AssertHelper(&local_13a0);
    std::__cxx11::string::~string((string *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_1398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1388);
  testing::PrintToString<biosoup::ProgressBar>(&local_13f0,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_13d0,"\"=>\"","::testing::PrintToString(pb)",(char (*) [3])0x167fb4,
             &local_13f0);
  std::__cxx11::string::~string((string *)&local_13f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13d0);
  if (!bVar1) {
    testing::Message::Message(&local_13f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__33.message_,&local_13f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__33.message_);
    testing::Message::~Message(&local_13f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13d0);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_1411 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1410,&local_1411,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1410);
  if (!bVar1) {
    testing::Message::Message(&local_1420);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_38.message_,(internal *)local_1410,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1428,&local_1420);
    testing::internal::AssertHelper::~AssertHelper(&local_1428);
    std::__cxx11::string::~string((string *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_1420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1410);
  testing::PrintToString<biosoup::ProgressBar>(&local_1478,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1458,"\"=>\"","::testing::PrintToString(pb)",(char (*) [3])0x167fb4,
             &local_1478);
  std::__cxx11::string::~string((string *)&local_1478);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1458);
  if (!bVar1) {
    testing::Message::Message(&local_1480);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__34.message_,&local_1480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__34.message_);
    testing::Message::~Message(&local_1480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1458);
  local_1499 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1498,&local_1499,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1498);
  if (!bVar1) {
    testing::Message::Message(&local_14a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_39.message_,(internal *)local_1498,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_14b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_14b0,&local_14a8);
    testing::internal::AssertHelper::~AssertHelper(&local_14b0);
    std::__cxx11::string::~string((string *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_14a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1498);
  testing::PrintToString<biosoup::ProgressBar>(&local_1500,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_14e0,"\"==\"","::testing::PrintToString(pb)",(char (*) [3])0x167fc8,
             &local_1500);
  std::__cxx11::string::~string((string *)&local_1500);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14e0);
  if (!bVar1) {
    testing::Message::Message(&local_1508);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_14e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__35.message_,&local_1508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__35.message_);
    testing::Message::~Message(&local_1508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14e0);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_1521 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1520,&local_1521,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1520);
  if (!bVar1) {
    testing::Message::Message(&local_1530);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_40.message_,(internal *)local_1520,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1538,&local_1530);
    testing::internal::AssertHelper::~AssertHelper(&local_1538);
    std::__cxx11::string::~string((string *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_1530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1520);
  testing::PrintToString<biosoup::ProgressBar>(&local_1588,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1568,"\"==\"","::testing::PrintToString(pb)",(char (*) [3])0x167fc8,
             &local_1588);
  std::__cxx11::string::~string((string *)&local_1588);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1568);
  if (!bVar1) {
    testing::Message::Message(&local_1590);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1568);
    testing::internal::AssertHelper::AssertHelper
              (&local_1598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1598,&local_1590);
    testing::internal::AssertHelper::~AssertHelper(&local_1598);
    testing::Message::~Message(&local_1590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1568);
  ProgressBar::ProgressBar((ProgressBar *)&gtest_ar_41.message_,8,1);
  ProgressBar::operator=((ProgressBar *)&gtest_ar.message_,(ProgressBar *)&gtest_ar_41.message_);
  ProgressBar::~ProgressBar((ProgressBar *)&gtest_ar_41.message_);
  testing::PrintToString<biosoup::ProgressBar>(&local_1600,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_15e0,"\" \"","::testing::PrintToString(pb)",(char (*) [2])0x169e66,
             &local_1600);
  std::__cxx11::string::~string((string *)&local_1600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15e0);
  if (!bVar1) {
    testing::Message::Message(&local_1608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_15e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__36.message_,&local_1608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__36.message_);
    testing::Message::~Message(&local_1608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15e0);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_1621 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1620,&local_1621,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1620);
  if (!bVar1) {
    testing::Message::Message(&local_1630);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_42.message_,(internal *)local_1620,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1638,&local_1630);
    testing::internal::AssertHelper::~AssertHelper(&local_1638);
    std::__cxx11::string::~string((string *)&gtest_ar_42.message_);
    testing::Message::~Message(&local_1630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1620);
  testing::PrintToString<biosoup::ProgressBar>(&local_1688,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1668,"\" \"","::testing::PrintToString(pb)",(char (*) [2])0x169e66,
             &local_1688);
  std::__cxx11::string::~string((string *)&local_1688);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1668);
  if (!bVar1) {
    testing::Message::Message(&local_1690);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1668);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__37.message_,&local_1690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__37.message_);
    testing::Message::~Message(&local_1690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1668);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_16a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_16a8,&local_16a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16a8);
  if (!bVar1) {
    testing::Message::Message(&local_16b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_43.message_,(internal *)local_16a8,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_16c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(&local_16c0,&local_16b8);
    testing::internal::AssertHelper::~AssertHelper(&local_16c0);
    std::__cxx11::string::~string((string *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_16b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16a8);
  testing::PrintToString<biosoup::ProgressBar>(&local_1710,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_16f0,"\" \"","::testing::PrintToString(pb)",(char (*) [2])0x169e66,
             &local_1710);
  std::__cxx11::string::~string((string *)&local_1710);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16f0);
  if (!bVar1) {
    testing::Message::Message(&local_1718);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_16f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__38.message_,&local_1718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__38.message_);
    testing::Message::~Message(&local_1718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16f0);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_1731 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1730,&local_1731,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1730);
  if (!bVar1) {
    testing::Message::Message(&local_1740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_44.message_,(internal *)local_1730,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1748,&local_1740);
    testing::internal::AssertHelper::~AssertHelper(&local_1748);
    std::__cxx11::string::~string((string *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_1740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1730);
  testing::PrintToString<biosoup::ProgressBar>(&local_1798,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1778,"\" \"","::testing::PrintToString(pb)",(char (*) [2])0x169e66,
             &local_1798);
  std::__cxx11::string::~string((string *)&local_1798);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1778);
  if (!bVar1) {
    testing::Message::Message(&local_17a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__39.message_,&local_17a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__39.message_);
    testing::Message::~Message(&local_17a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1778);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_17b9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_17b8,&local_17b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17b8);
  if (!bVar1) {
    testing::Message::Message(&local_17c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_45.message_,(internal *)local_17b8,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_17d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_17d0,&local_17c8);
    testing::internal::AssertHelper::~AssertHelper(&local_17d0);
    std::__cxx11::string::~string((string *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_17c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17b8);
  testing::PrintToString<biosoup::ProgressBar>(&local_1820,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1800,"\" \"","::testing::PrintToString(pb)",(char (*) [2])0x169e66,
             &local_1820);
  std::__cxx11::string::~string((string *)&local_1820);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1800);
  if (!bVar1) {
    testing::Message::Message(&local_1828);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__40.message_,&local_1828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__40.message_);
    testing::Message::~Message(&local_1828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1800);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_1841 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1840,&local_1841,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1840);
  if (!bVar1) {
    testing::Message::Message(&local_1850);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_46.message_,(internal *)local_1840,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1858,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1858,&local_1850);
    testing::internal::AssertHelper::~AssertHelper(&local_1858);
    std::__cxx11::string::~string((string *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_1850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1840);
  testing::PrintToString<biosoup::ProgressBar>(&local_18a8,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1888,"\" \"","::testing::PrintToString(pb)",(char (*) [2])0x169e66,
             &local_18a8);
  std::__cxx11::string::~string((string *)&local_18a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1888);
  if (!bVar1) {
    testing::Message::Message(&local_18b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1888);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__41.message_,&local_18b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__41.message_);
    testing::Message::~Message(&local_18b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1888);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_18c9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_18c8,&local_18c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18c8);
  if (!bVar1) {
    testing::Message::Message(&local_18d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_47.message_,(internal *)local_18c8,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_18e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_18e0,&local_18d8);
    testing::internal::AssertHelper::~AssertHelper(&local_18e0);
    std::__cxx11::string::~string((string *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_18d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18c8);
  testing::PrintToString<biosoup::ProgressBar>(&local_1930,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1910,"\" \"","::testing::PrintToString(pb)",(char (*) [2])0x169e66,
             &local_1930);
  std::__cxx11::string::~string((string *)&local_1930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1910);
  if (!bVar1) {
    testing::Message::Message(&local_1938);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1910);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__42.message_,&local_1938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__42.message_);
    testing::Message::~Message(&local_1938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1910);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_1951 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1950,&local_1951,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1950);
  if (!bVar1) {
    testing::Message::Message(&local_1960);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_48.message_,(internal *)local_1950,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1968,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1968,&local_1960);
    testing::internal::AssertHelper::~AssertHelper(&local_1968);
    std::__cxx11::string::~string((string *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_1960);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1950);
  testing::PrintToString<biosoup::ProgressBar>(&local_19b8,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1998,"\" \"","::testing::PrintToString(pb)",(char (*) [2])0x169e66,
             &local_19b8);
  std::__cxx11::string::~string((string *)&local_19b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1998);
  if (!bVar1) {
    testing::Message::Message(&local_19c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1998);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__43.message_,&local_19c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__43.message_);
    testing::Message::~Message(&local_19c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1998);
  local_19d9 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_19d8,&local_19d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19d8);
  if (!bVar1) {
    testing::Message::Message(&local_19e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_49.message_,(internal *)local_19d8,(AssertionResult *)"++pb",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=(&local_19f0,&local_19e8);
    testing::internal::AssertHelper::~AssertHelper(&local_19f0);
    std::__cxx11::string::~string((string *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_19e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19d8);
  testing::PrintToString<biosoup::ProgressBar>(&local_1a40,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1a20,"\"=\"","::testing::PrintToString(pb)",(char (*) [2])0x167fc9,
             &local_1a40);
  std::__cxx11::string::~string((string *)&local_1a40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a20);
  if (!bVar1) {
    testing::Message::Message(&local_1a48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__44.message_,&local_1a48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__44.message_);
    testing::Message::~Message(&local_1a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a20);
  bVar1 = ProgressBar::operator++((ProgressBar *)&gtest_ar.message_);
  local_1a61 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a60,&local_1a61,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a60);
  if (!bVar1) {
    testing::Message::Message(&local_1a70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_50.message_,(internal *)local_1a60,(AssertionResult *)"++pb",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a78,&local_1a70);
    testing::internal::AssertHelper::~AssertHelper(&local_1a78);
    std::__cxx11::string::~string((string *)&gtest_ar_50.message_);
    testing::Message::~Message(&local_1a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a60);
  testing::PrintToString<biosoup::ProgressBar>(&local_1ac8,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1aa8,"\"=\"","::testing::PrintToString(pb)",(char (*) [2])0x167fc9,
             &local_1ac8);
  std::__cxx11::string::~string((string *)&local_1ac8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1aa8);
  if (!bVar1) {
    testing::Message::Message(&local_1ad0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1aa8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1ad8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1ad8,&local_1ad0);
    testing::internal::AssertHelper::~AssertHelper(&local_1ad8);
    testing::Message::~Message(&local_1ad0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1aa8);
  ProgressBar::ProgressBar((ProgressBar *)&gtest_ar_51.message_,8,0);
  ProgressBar::operator=((ProgressBar *)&gtest_ar.message_,(ProgressBar *)&gtest_ar_51.message_);
  ProgressBar::~ProgressBar((ProgressBar *)&gtest_ar_51.message_);
  testing::PrintToString<biosoup::ProgressBar>(&local_1b40,(ProgressBar *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1b20,"\" \"","::testing::PrintToString(pb)",(char (*) [2])0x169e66,
             &local_1b40);
  std::__cxx11::string::~string((string *)&local_1b40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b20);
  if (!bVar1) {
    testing::Message::Message(&local_1b48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b20);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/progress_bar_test.cpp"
               ,0x78,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b50,&local_1b48);
    testing::internal::AssertHelper::~AssertHelper(&local_1b50);
    testing::Message::~Message(&local_1b48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b20);
  ProgressBar::~ProgressBar((ProgressBar *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(BiosoupProgressBarTest, Operator) {
  ProgressBar pb{8, 8};
  EXPECT_EQ("        ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=>      ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("==>     ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("===>    ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("====>   ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=====>  ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("======> ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=======>", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("========", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("========", ::testing::PrintToString(pb));

  pb = {8, 9};
  EXPECT_EQ("        ", ::testing::PrintToString(pb));

  pb = {8, 7};
  EXPECT_EQ("       ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("       ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=>     ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("==>    ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("===>   ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("====>  ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=====> ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("======>", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=======", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=======", ::testing::PrintToString(pb));

  pb = {8, 4};
  EXPECT_EQ("    ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("    ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=>  ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=>  ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("==> ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("==> ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("===>", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("===>", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("====", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("====", ::testing::PrintToString(pb));

  pb = {8, 2};
  EXPECT_EQ("  ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("  ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("  ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("  ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=>", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=>", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=>", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=>", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("==", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("==", ::testing::PrintToString(pb));

  pb = {8, 1};
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=", ::testing::PrintToString(pb));

  pb = {8, 0};
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
}